

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_json_object_end(emitter_t *emitter)

{
  if (emitter->output < emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
    if (emitter->output != emitter_output_json_compact) {
      emitter_printf(emitter,anon_var_dwarf_3b657a3 + 8);
      emitter_indent(emitter);
    }
    emitter_printf(emitter,"}");
    return;
  }
  return;
}

Assistant:

static inline void
emitter_json_object_end(emitter_t *emitter) {
	if (emitter_outputs_json(emitter)) {
		assert(emitter->nesting_depth > 0);
		emitter_nest_dec(emitter);
		if (emitter->output != emitter_output_json_compact) {
			emitter_printf(emitter, "\n");
			emitter_indent(emitter);
		}
		emitter_printf(emitter, "}");
	}
}